

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

Frame * __thiscall Frame::limit(Frame *this,size_t newSize)

{
  unsigned_long *puVar1;
  pointer puVar2;
  size_t local_18;
  size_t newSize_local;
  Frame *this_local;
  
  local_18 = newSize;
  newSize_local = (size_t)this;
  puVar1 = std::min<unsigned_long>(&this->m_Size,&local_18);
  this->m_Size = *puVar1;
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->m_Data);
  this->m_Pos = puVar2;
  return this;
}

Assistant:

Frame& Frame::limit(size_t newSize)
{
    m_Size = std::min(m_Size, newSize);
    m_Pos = m_Data.get();
    return *this;
}